

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool minihttp::SplitURI(string *uri,string *protocol,string *host,string *file,int *port,
                       bool *useSSL)

{
  byte bVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char *__haystack;
  long lVar10;
  string *psVar11;
  char *pcVar12;
  uint uVar13;
  string *psVar14;
  undefined8 uVar15;
  undefined1 auStack_ab [3];
  ulong uStack_a8;
  string *psStack_a0;
  string *psStack_98;
  pointer pcStack_90;
  undefined8 uStack_88;
  code *pcStack_80;
  string *local_70;
  string *local_68;
  int *local_60;
  bool *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  __haystack = (uri->_M_dataplus)._M_p;
  pcStack_80 = (code *)0x106b4d;
  local_70 = file;
  local_68 = host;
  local_58 = useSSL;
  pcVar7 = strstr(__haystack,"//");
  *port = -1;
  local_60 = port;
  if (pcVar7 == (char *)0x0) {
    uVar15 = 0;
    goto LAB_00106c37;
  }
  pcStack_80 = (code *)0x106b74;
  uVar8 = std::__cxx11::string::find((char)uri,0x3a);
  pcStack_80 = (code *)0x106b86;
  uVar9 = std::__cxx11::string::find((char)uri,0x2f);
  if (uVar8 < uVar9) {
    pcStack_80 = (code *)0x106ba0;
    std::__cxx11::string::substr((ulong)local_50,(ulong)uri);
    pcStack_80 = (code *)0x106bab;
    std::__cxx11::string::operator=((string *)protocol,(string *)local_50);
    if (local_50[0] != local_40) {
      pcStack_80 = (code *)0x106bc5;
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  pcStack_80 = (code *)0x106bdf;
  iVar6 = strncmp(__haystack,"http://",7);
  uVar15 = CONCAT71((int7)(uVar8 >> 8),iVar6 != 0);
  if (iVar6 == 0) {
    iVar6 = 0x50;
LAB_00106c23:
    *local_60 = iVar6;
    __haystack = pcVar7 + 2;
    bVar4 = true;
  }
  else {
    pcStack_80 = (code *)0x106c01;
    iVar6 = strncmp(__haystack,"https://",8);
    if (iVar6 == 0) {
      iVar6 = 0x1bb;
      goto LAB_00106c23;
    }
    uVar15 = 0;
    bVar4 = false;
  }
  if (!bVar4) {
    return false;
  }
LAB_00106c37:
  pcStack_80 = (code *)0x106c44;
  pcVar7 = strchr(__haystack,0x2f);
  psVar14 = local_68;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = (char *)local_68->_M_string_length;
    pcStack_80 = (code *)0x106cc9;
    strlen(__haystack);
    pcStack_80 = (code *)0x106cdc;
    std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar7,(ulong)__haystack);
    pcVar12 = (char *)local_70->_M_string_length;
    pcVar7 = "/";
    psVar11 = local_70;
  }
  else {
    pcStack_80 = (code *)0x106c65;
    std::__cxx11::string::substr((ulong)local_50,(ulong)uri);
    psVar14 = local_68;
    pcStack_80 = (code *)0x106c75;
    std::__cxx11::string::operator=((string *)local_68,(string *)local_50);
    if (local_50[0] != local_40) {
      pcStack_80 = (code *)0x106c8f;
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uri = local_70;
    pcVar12 = (char *)local_70->_M_string_length;
    pcStack_80 = (code *)0x106ca0;
    strlen(pcVar7);
    psVar11 = uri;
  }
  pcStack_80 = (code *)0x106cf9;
  std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar12,(ulong)pcVar7);
  pcStack_80 = (code *)0x106d08;
  uVar8 = std::__cxx11::string::find((char)psVar14,0x3a);
  if (uVar8 != 0xffffffffffffffff) {
    pcVar2 = (psVar14->_M_dataplus)._M_p;
    pcStack_80 = (code *)0x106d21;
    iVar6 = atoi(pcVar2 + uVar8 + 1);
    *local_60 = iVar6;
    if (psVar14->_M_string_length < uVar8) {
      pcVar12 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar7 = "basic_string::erase";
      pcStack_80 = URLEncode;
      uVar5 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar8);
      lVar3 = *(long *)((long)pcVar12 + 8);
      if (lVar3 != 0) {
        lVar10 = 0;
        uStack_a8 = uVar8;
        psStack_a0 = psVar14;
        psStack_98 = uri;
        pcStack_90 = pcVar2;
        uStack_88 = uVar15;
        pcStack_80 = (code *)__haystack;
        do {
          bVar1 = *(byte *)(*(long *)pcVar12 + lVar10);
          uVar13 = (uint)bVar1;
          iVar6 = isalnum(uVar13);
          if ((((iVar6 == 0) && (2 < uVar13 - 0x2c)) && (bVar1 != 0x20)) && (uVar13 != 0x5f)) {
            uVar5 = std::__cxx11::string::append(pcVar7,(ulong)auStack_ab);
          }
          else {
            uVar5 = std::__cxx11::string::push_back((char)pcVar7);
          }
          lVar10 = lVar10 + 1;
        } while (lVar3 != lVar10);
      }
      return (bool)uVar5;
    }
    psVar14->_M_string_length = uVar8;
    pcVar2[uVar8] = '\0';
  }
  *local_58 = SUB81(uVar15,0);
  return true;
}

Assistant:

bool SplitURI(const std::string& uri, std::string& protocol, std::string& host, std::string& file, int& port, bool& useSSL)
{
    const char *p = uri.c_str();
    const char *sl = strstr(p, "//");
    unsigned int offs = 0;
    port = -1;
    bool ssl = false;
    if(sl)
    {
        size_t colon = uri.find(':');
        size_t firstslash = uri.find('/');
        if(colon < firstslash)
            protocol = uri.substr(0, colon);
        if(strncmp(p, "http://", 7) == 0)
        {
            offs = 7;
            port = 80;
        }
        else if(strncmp(p, "https://", 8) == 0)
        {
            offs = 8;
            port = 443;
            ssl = true;
        }
        else
            return false;

        p = sl + 2;
    }

    sl = strchr(p, '/');
    if(!sl)
    {
        host = p;
        file = "/";
    }
    else
    {
        host = uri.substr(offs, sl - p);
        file = sl;
    }

    size_t colon = host.find(':');
    if(colon != std::string::npos)
    {
        port = atoi(host.c_str() + colon + 1);
        host.erase(colon);
    }
    useSSL = ssl;

    return true;
}